

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O0

uint32_t __thiscall DebugInfo::CountSizeInSection(DebugInfo *this,SectionType type)

{
  bool bVar1;
  reference pSVar2;
  SymbolInfo *sym;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1;
  uint32_t size;
  SectionType type_local;
  DebugInfo *this_local;
  
  __range1._0_4_ = 0;
  __end1 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin(&this->m_Symbols);
  sym = (SymbolInfo *)std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end(&this->m_Symbols);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                                *)&sym);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
             ::operator*(&__end1);
    if (pSVar2->sectionType == type) {
      __range1._0_4_ = pSVar2->size + (uint32_t)__range1;
    }
    __gnu_cxx::
    __normal_iterator<const_SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>::
    operator++(&__end1);
  }
  return (uint32_t)__range1;
}

Assistant:

uint32_t DebugInfo::CountSizeInSection(SectionType type) const
{
    uint32_t size = 0;
    for (const auto& sym : m_Symbols)
    {
        if (sym.sectionType == type)
            size += sym.size;
    }
    return size;
}